

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_NtkFindDivs(Acb_Ntk_t *p,Vec_Int_t *vSupp,Vec_Bit_t *vBlock,int fVerbose)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Acb_ObjType_t AVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  p_00 = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  for (iVar8 = 0; iVar8 < vSupp->nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(vSupp,iVar8);
    iVar2 = Vec_IntEntry(&p->vCis,iVar2);
    Acb_ObjSetTravIdCur(p,iVar2);
    iVar3 = Acb_ObjWeight(p,iVar2);
    if (0 < iVar3) {
      Vec_IntPush(p_00,iVar2);
    }
  }
  Acb_NtkIncTravId(p);
  uVar7 = 1;
  do {
    uVar11 = (uint)uVar7;
    if ((p->vObjType).nSize <= (int)uVar11) {
      uVar11 = p_00->nSize;
      uVar5 = 1;
      if (1 < (int)uVar11) {
        uVar5 = uVar11;
      }
      piVar1 = p_00->pArray;
      uVar10 = 1;
      for (uVar7 = 0; uVar7 != uVar5 - 1; uVar7 = uVar7 + 1) {
        uVar13 = uVar7 & 0xffffffff;
        uVar9 = uVar10;
        while( true ) {
          uVar12 = (uint)uVar13;
          if (uVar11 == uVar9) break;
          iVar8 = Vec_IntEntry(&p->vObjWeight,piVar1[uVar9]);
          iVar2 = Vec_IntEntry(&p->vObjWeight,piVar1[(int)uVar12]);
          uVar6 = (uint)uVar9;
          if (iVar2 <= iVar8) {
            uVar6 = uVar12;
          }
          uVar9 = uVar9 + 1;
          uVar13 = (ulong)uVar6;
        }
        iVar8 = piVar1[uVar7];
        piVar1[uVar7] = piVar1[(int)uVar12];
        piVar1[(int)uVar12] = iVar8;
        uVar10 = uVar10 + 1;
      }
      uVar5 = 3000;
      if ((int)uVar11 < 3000) {
        uVar5 = uVar11;
      }
      if (fVerbose == 0) {
        Vec_IntShrink(p_00,uVar5);
      }
      else {
        printf("Reducing divisor set from %d to ");
        Vec_IntShrink(p_00,uVar5);
        printf("%d.\n",(ulong)(uint)p_00->nSize);
      }
      return p_00;
    }
    AVar4 = Acb_ObjType(p,uVar11);
    if (AVar4 != ABC_OPER_NONE) {
      iVar8 = Acb_ObjIsCio(p,uVar11);
      if (iVar8 == 0) {
        if (vBlock->nSize <= (int)uVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)vBlock->pArray[uVar7 >> 5] >> (uVar11 & 0x1f) & 1) == 0) {
          iVar8 = Acb_ObjWeight(p,uVar11);
          if (0 < iVar8) {
            iVar8 = Acb_NtkFindDivs_rec(p,uVar11);
            if (iVar8 != 0) {
              Vec_IntPush(p_00,uVar11);
            }
          }
        }
      }
    }
    uVar7 = (ulong)(uVar11 + 1);
  } while( true );
}

Assistant:

Vec_Int_t * Acb_NtkFindDivs( Acb_Ntk_t * p, Vec_Int_t * vSupp, Vec_Bit_t * vBlock, int fVerbose )
{
    int fPrintWeights = 0;
    int nDivLimit = 3000;
    int i, iObj;
    Vec_Int_t * vDivs = Vec_IntAlloc( 1000 );
    // mark inputs
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCiVec( vSupp, p, iObj, i )
    {
        Acb_ObjSetTravIdCur( p, iObj );
        if ( Acb_ObjWeight(p, iObj) > 0 )
            Vec_IntPush( vDivs, iObj );
    }
    // collect nodes whose support is contained in vSupp
    Acb_NtkIncTravId( p );
    Acb_NtkForEachNode( p, iObj )
        if ( !Vec_BitEntry(vBlock, iObj) && Acb_ObjWeight(p, iObj) > 0 && Acb_NtkFindDivs_rec(p, iObj) )
            Vec_IntPush( vDivs, iObj );
    // sort divisors by cost (first cheap ones; later expensive ones)
    Vec_IntSelectSortCost( Vec_IntArray(vDivs), Vec_IntSize(vDivs), &p->vObjWeight );
    //Vec_IntPrint( vDivs );
    nDivLimit = Abc_MinInt( Vec_IntSize(vDivs), nDivLimit );
    if ( fPrintWeights )
    {
//        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
//            printf( "%d:%d (w=%d)   ", i, iObj, Vec_IntEntry(&p->vObjWeight, iObj) );
//        printf( "\n" );

        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 100) % 10 );
        printf( "\n" );
        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 10) % 10 );
        printf( "\n" );
        printf( "    : " );
        Vec_IntForEachEntryStop( vDivs, iObj, i, nDivLimit )
            printf( "%d", (Vec_IntEntry(&p->vObjWeight, iObj) / 1) % 10 );
        printf( "\n" );
    }
    if ( fVerbose )
    printf( "Reducing divisor set from %d to ", Vec_IntSize(vDivs) );
    Vec_IntShrink( vDivs, nDivLimit );
    if ( fVerbose )
    printf( "%d.\n", Vec_IntSize(vDivs) );
    return vDivs;
}